

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O1

void verifyOrthonormal<Imath_3_2::Matrix33<double>>
               (Matrix33<double> *A,BaseType_conflict3 threshold)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double *pdVar10;
  long lVar11;
  long lVar12;
  Matrix33<double> tmp;
  double local_48;
  double dStack_40;
  double local_38;
  double local_30;
  double local_28;
  double dStack_20;
  double local_18;
  double local_10;
  double local_8;
  
  pdVar10 = &local_48;
  dVar1 = A->x[2][0];
  dVar2 = A->x[0][0];
  dVar3 = A->x[0][1];
  dVar4 = A->x[2][1];
  dVar5 = A->x[0][2];
  dVar6 = A->x[2][2];
  dVar7 = A->x[1][1];
  dVar8 = A->x[1][0];
  dVar9 = A->x[1][2];
  dStack_40 = dVar9 * dVar5 + dVar8 * dVar2 + dVar7 * dVar3;
  local_48 = dVar5 * dVar5 + dVar2 * dVar2 + dVar3 * dVar3;
  local_38 = dVar5 * dVar6 + dVar2 * dVar1 + dVar3 * dVar4;
  local_30 = dStack_40;
  dStack_20 = dVar6 * dVar9 + dVar1 * dVar8 + dVar4 * dVar7;
  local_28 = dVar9 * dVar9 + dVar8 * dVar8 + dVar7 * dVar7;
  local_18 = local_38;
  local_10 = dStack_20;
  local_8 = dVar6 * dVar6 + dVar1 * dVar1 + dVar4 * dVar4;
  lVar11 = 0;
  do {
    lVar12 = 0;
    do {
      if (lVar11 == lVar12) {
        if (threshold <= ABS(*(double *)((long)pdVar10 + lVar12 * 8) + -1.0)) {
          __assert_fail("std::abs (prod[i][j] - 1) < threshold",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                        ,0x3c,
                        "void verifyOrthonormal(const TM &, const typename TM::BaseType) [TM = Imath_3_2::Matrix33<double>]"
                       );
        }
      }
      else if (threshold <= ABS(*(double *)((long)pdVar10 + lVar12 * 8))) {
        __assert_fail("std::abs (prod[i][j]) < threshold",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                      ,0x3e,
                      "void verifyOrthonormal(const TM &, const typename TM::BaseType) [TM = Imath_3_2::Matrix33<double>]"
                     );
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    lVar11 = lVar11 + 1;
    pdVar10 = (double *)((long)pdVar10 + 0x18);
  } while (lVar11 != 3);
  return;
}

Assistant:

void
verifyOrthonormal (const TM& A, const typename TM::BaseType threshold)
{
    const TM prod = A * A.transposed ();
    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            if (i == j)
                assert (std::abs (prod[i][j] - 1) < threshold);
            else
                assert (std::abs (prod[i][j]) < threshold);
}